

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool has_cycle_reference(render_state_t *state,element_t *element)

{
  element_t *element_local;
  render_state_t *state_local;
  
  element_local = (element_t *)state;
  do {
    if (element == element_local->parent) {
      return true;
    }
    element_local = *(element_t **)element_local;
  } while (element_local != (element_t *)0x0);
  return false;
}

Assistant:

static bool has_cycle_reference(const render_state_t* state, const element_t* element)
{
    do {
        if(element == state->element)
            return true;
        state = state->parent;
    } while(state);
    return false;
}